

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpio.c
# Opt level: O1

void t9(void)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  uint32_t p [10];
  undefined8 local_48 [4];
  uint local_24;
  
  puts("Script store/run/status/stop/delete tests.");
  gpioWrite(0x19,0);
  t9_count = 0;
  gpioSetAlertFunc(0x19,t9cbf);
  uVar1 = gpioStoreScript("   ld p9 p0   tag 0   w p1 1   mils 5   w p1 0   mils 5   dcr p9   jp 0")
  ;
  do {
    time_sleep(0x3fb999999999999a);
    iVar2 = gpioScriptStatus(uVar1,local_48);
    iVar3 = t9_count;
  } while (iVar2 == 0);
  local_48[0] = 0x1900000063;
  gpioRunScript(uVar1,2,local_48);
  time_sleep(0x4000000000000000);
  CHECK(9,1,t9_count - iVar3,100,0,"store/run script");
  iVar3 = t9_count;
  local_48[0] = 0x19000000c8;
  gpioRunScript(uVar1,2,local_48);
  time_sleep(0x3fb999999999999a);
  iVar2 = gpioScriptStatus(uVar1,local_48);
  while (iVar2 == 2) {
    time_sleep(0x3fe0000000000000);
    iVar2 = gpioScriptStatus(uVar1,local_48);
  }
  iVar3 = t9_count - iVar3;
  time_sleep(0x3fb999999999999a);
  CHECK(9,2,iVar3,0xc9,0,"run script/script status");
  iVar3 = t9_count;
  local_48[0] = 0x19000007d0;
  gpioRunScript(uVar1,2,local_48);
  time_sleep(0x3fb999999999999a);
  iVar2 = gpioScriptStatus(uVar1,local_48);
  while (iVar2 == 2) {
    if (local_24 < 0x76c) {
      gpioStopScript(uVar1);
    }
    time_sleep(0x3fb999999999999a);
    iVar2 = gpioScriptStatus(uVar1,local_48);
  }
  iVar3 = t9_count - iVar3;
  time_sleep(0x3fb999999999999a);
  CHECK(9,3,iVar3,0x6e,10,"run/stop script/script status");
  iVar3 = gpioDeleteScript(uVar1);
  CHECK(9,4,iVar3,0,0,"delete script");
  return;
}

Assistant:

void t9()
{
   int s, oc, c, e;
   uint32_t p[10];

   /*
   100 loops per second
   p0 number of loops
   p1 GPIO
   */
   char *script="\
   ld p9 p0\
   tag 0\
   w p1 1\
   mils 5\
   w p1 0\
   mils 5\
   dcr p9\
   jp 0";

   printf("Script store/run/status/stop/delete tests.\n");

   gpioWrite(GPIO, 0); /* need known state */

   t9_count = 0;

   gpioSetAlertFunc(GPIO, t9cbf);

   s = gpioStoreScript(script);

   while (1)
   {
      /* loop until script initialised */
      time_sleep(0.1);
      e = gpioScriptStatus(s, p);
      if (e != PI_SCRIPT_INITING) break;
   }

   oc = t9_count;
   p[0] = 99;
   p[1] = GPIO;
   gpioRunScript(s, 2, p);
   time_sleep(2);
   c = t9_count - oc;
   CHECK(9, 1, c, 100, 0, "store/run script");

   oc = t9_count;
   p[0] = 200;
   p[1] = GPIO;
   gpioRunScript(s, 2, p);
   time_sleep(0.1);
   while (1)
   {
      e = gpioScriptStatus(s, p);
      if (e != PI_SCRIPT_RUNNING) break;
      time_sleep(0.5);
   }
   c = t9_count - oc;
   time_sleep(0.1);
   CHECK(9, 2, c, 201, 0, "run script/script status");

   oc = t9_count;
   p[0] = 2000;
   p[1] = GPIO;
   gpioRunScript(s, 2, p);
   time_sleep(0.1);
   while (1)
   {
      e = gpioScriptStatus(s, p);
      if (e != PI_SCRIPT_RUNNING) break;
      if (p[9] < 1900) gpioStopScript(s);
      time_sleep(0.1);
   }
   c = t9_count - oc;
   time_sleep(0.1);
   CHECK(9, 3, c, 110, 10, "run/stop script/script status");

   e = gpioDeleteScript(s);
   CHECK(9, 4, e, 0, 0, "delete script");
}